

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sl_general.c
# Opt level: O3

char * concat(char *s1,char *s2)

{
  size_t __n;
  size_t __n_00;
  char *__dest;
  
  if (s1 == (char *)0x0 && s2 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    if (s1 == (char *)0x0) {
      __n = 0;
    }
    else {
      __n = strlen(s1);
    }
    if (s2 == (char *)0x0) {
      __n_00 = 0;
    }
    else {
      __n_00 = strlen(s2);
    }
    __dest = (char *)safeMalloc(__n + __n_00 + 1);
    if (s1 != (char *)0x0) {
      memcpy(__dest,s1,__n);
    }
    if (s2 != (char *)0x0) {
      memcpy(__dest + __n,s2,__n_00);
    }
    __dest[__n_00 + __n] = '\0';
  }
  return __dest;
}

Assistant:

extern char* concat( const char *s1, const char *s2 ) {

    // if both arguments are NULL, return a NULL...
    if( (s1 == NULL) && (s2 == NULL) ) return NULL;

    // get the lengths just once (optimization)...
    const size_t len1 = s1 ? strlen( s1 ) : 0;
    const size_t len2 = s2 ? strlen( s2 ) : 0;

    // get the memory required for the concatenated strings plus the terminator...
    char *result = safeMalloc( len1 + len2 + 1 );

    // build our result...
    if( s1 != NULL ) memcpy(result, s1, len1);
    if( s2 != NULL ) memcpy(result + len1, s2, len2 );

    // insert the terminator...
    *(result + len1 + len2) = 0;

    return result;
}